

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningRPW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,EulerAngles *OrientationOut,
          KFLOAT32 totalTimeSinceReset)

{
  Vector local_58;
  WorldCoordinates local_40;
  
  DATA_TYPE::Vector::operator*(&local_58,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_40,&this->m_initPosition,&local_58);
  PositionOut->m_f64Z = local_40.m_f64Z;
  PositionOut->m_f64X = local_40.m_f64X;
  PositionOut->m_f64Y = local_40.m_f64Y;
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_40.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  calcOrientation_simplified(this,OrientationOut,totalTimeSinceReset);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningRPW( WorldCoordinates & PositionOut, EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) );
    //calcOrientation(OrientationOut);
    calcOrientation_simplified( OrientationOut, totalTimeSinceReset );
}